

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O1

MPP_RET mpp_skip_bits(BitReadCtx_t *bitctx,RK_S32 num_bits)

{
  int iVar1;
  MPP_RET MVar2;
  RK_S32 RVar3;
  
  RVar3 = num_bits;
  do {
    iVar1 = bitctx->num_remaining_bits_in_curr_byte_;
    if (RVar3 <= iVar1) {
      bitctx->num_remaining_bits_in_curr_byte_ = iVar1 - RVar3;
      bitctx->used_bits = bitctx->used_bits + num_bits;
      return MPP_OK;
    }
    RVar3 = RVar3 - iVar1;
    MVar2 = (*bitctx->update_curbyte)(bitctx);
  } while (MVar2 == MPP_OK);
  return MPP_ERR_READ_BIT;
}

Assistant:

MPP_RET mpp_skip_bits(BitReadCtx_t *bitctx, RK_S32 num_bits)
{
    RK_S32 bits_left = num_bits;

    while (bitctx->num_remaining_bits_in_curr_byte_ < bits_left) {
        // Take all that's left in current byte, shift to make space for the rest.
        bits_left -= bitctx->num_remaining_bits_in_curr_byte_;
        if (bitctx->update_curbyte(bitctx)) {
            return  MPP_ERR_READ_BIT;
        }
    }
    bitctx->num_remaining_bits_in_curr_byte_ -= bits_left;
    bitctx->used_bits += num_bits;

    return MPP_OK;
}